

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool processSources(cmTarget *tgt,
                   vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  cmMakefile *this;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *__x;
  bool bVar4;
  char *pcVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmake *this_01;
  ostream *poVar7;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  long lVar11;
  pointer sourceName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer pbVar13;
  byte unaff_R14B;
  byte bVar14;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  string usedSources;
  string fullPath;
  string local_260;
  cmTarget *local_240;
  cmMakefile *local_238;
  pointer *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  cmake *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  cmGeneratorExpressionDAGChecker *local_1b8;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_1b0;
  ostringstream err;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer pcStack_188;
  pointer local_180;
  ios_base local_138 [264];
  
  if (entries ==
      (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       *)srcs) {
    bVar14 = 0;
  }
  else {
    local_238 = tgt->Makefile;
    paVar1 = &fullPath.field_2;
    bVar14 = 0;
    local_240 = tgt;
    local_1c0 = srcs;
    local_1b8 = (cmGeneratorExpressionDAGChecker *)config;
    local_1b0 = uniqueSrcs;
    do {
      paVar12 = &usedSources.field_2;
      puVar2 = (undefined8 *)(*(pointer *)entries)->_M_string_length;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      usedSources._M_dataplus._M_p = (pointer)paVar12;
      local_230 = (pointer *)entries;
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,local_238,(string *)CONCAT71(in_stack_00000009,debugSources),false,
                          local_240,local_240,local_1b8,&usedSources);
      std::__cxx11::string::string((string *)&err,pcVar5,(allocator *)&fullPath);
      cmSystemTools::ExpandListArgument((string *)&err,&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_err != &local_198) {
        operator_delete(_err,local_198._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != paVar12) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      if (((*local_230)->_M_dataplus)._M_p[0x150] != '\0') {
        bVar14 = 1;
      }
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        usedSources._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        do {
          this_00 = cmMakefile::GetOrCreateSource(local_238,sourceName,false);
          usedSources._M_string_length = 0;
          usedSources.field_2._M_local_buf[0] = '\0';
          usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
          psVar6 = cmSourceFile::GetFullPath(this_00,&usedSources);
          pcVar3 = (psVar6->_M_dataplus)._M_p;
          fullPath._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fullPath,pcVar3,pcVar3 + psVar6->_M_string_length);
          if (fullPath._M_string_length == 0) {
            if (usedSources._M_string_length != 0) {
              this_01 = cmMakefile::GetCMakeInstance(local_238);
              cmake::IssueMessage(this_01,FATAL_ERROR,&usedSources,
                                  &((local_240->Internal).Pointer)->Backtrace);
            }
LAB_00299e12:
            bVar4 = false;
            unaff_R14B = bVar14;
          }
          else {
            if ((puVar2[1] != 0) &&
               (bVar4 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p), !bVar4))
            {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
              if (puVar2[1] == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&err,"Found relative path while evaluating sources of \"",0x31
                          );
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&err,(local_240->Name)._M_dataplus._M_p,
                                    (local_240->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\":\n  \"",6);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(sourceName->_M_dataplus)._M_p,
                                    sourceName->_M_string_length);
                lVar11 = 2;
                pcVar5 = "\"\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&err,"Target \"",8);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&err,(char *)*puVar2,puVar2[1]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(sourceName->_M_dataplus)._M_p,
                                    sourceName->_M_string_length);
                lVar11 = 1;
                pcVar5 = "\"";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,lVar11);
              this = local_240->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(this,FATAL_ERROR,&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
              std::ios_base::~ios_base(local_138);
              goto LAB_00299e12;
            }
            bVar4 = true;
            std::__cxx11::string::_M_assign((string *)sourceName);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullPath._M_dataplus._M_p != paVar1) {
            operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
            operator_delete(usedSources._M_dataplus._M_p,
                            CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                     usedSources.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entrySources);
            bVar14 = unaff_R14B;
            goto LAB_0029a2b3;
          }
          sourceName = sourceName + 1;
        } while (sourceName !=
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        pbVar13 = entrySources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        if (sourceName !=
            entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            _err = (pointer)&local_198;
            pcVar3 = (pbVar13->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&err,pcVar3,pcVar3 + pbVar13->_M_string_length);
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                      *)dagChecker,*(long *)((long)&(dagChecker->Target).field_2 + 8) + 1);
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::insert_unique_noresize
                      ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                        *)&fullPath,
                       (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                        *)dagChecker,(value_type *)&err);
            if ((fullPath.field_2._M_local_buf[0] == '\x01') &&
               (std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1b0,(value_type *)&err), in_stack_00000010 != '\0')) {
              std::operator+(&local_260," * ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &err);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_260);
              psVar9 = (size_type *)(plVar8 + 2);
              if ((size_type *)*plVar8 == psVar9) {
                fullPath.field_2._M_allocated_capacity = *psVar9;
                fullPath.field_2._8_8_ = plVar8[3];
                fullPath._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                fullPath.field_2._M_allocated_capacity = *psVar9;
                fullPath._M_dataplus._M_p = (pointer)*plVar8;
              }
              fullPath._M_string_length = plVar8[1];
              *plVar8 = (long)psVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&usedSources,(ulong)fullPath._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fullPath._M_dataplus._M_p != paVar1) {
                operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_err != &local_198) {
              operator_delete(_err,local_198._M_allocated_capacity + 1);
            }
            pbVar13 = pbVar13 + 1;
          } while (pbVar13 !=
                   entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if (usedSources._M_string_length != 0) {
            local_1c8 = cmMakefile::GetCMakeInstance(local_238);
            local_1e8[0] = local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"Used sources for target ","");
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_1e8,(ulong)(local_240->Name)._M_dataplus._M_p)
            ;
            local_208 = &local_1f8;
            plVar10 = plVar8 + 2;
            if ((long *)*plVar8 == plVar10) {
              local_1f8 = *plVar10;
              lStack_1f0 = plVar8[3];
            }
            else {
              local_1f8 = *plVar10;
              local_208 = (long *)*plVar8;
            }
            local_200 = plVar8[1];
            *plVar8 = (long)plVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_208);
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            psVar9 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_260.field_2._M_allocated_capacity = *psVar9;
              local_260.field_2._8_8_ = plVar8[3];
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar9;
              local_260._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_260._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_260,(ulong)usedSources._M_dataplus._M_p);
            psVar9 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar9) {
              fullPath.field_2._M_allocated_capacity = *psVar9;
              fullPath.field_2._8_8_ = plVar8[3];
              fullPath._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar9;
              fullPath._M_dataplus._M_p = (pointer)*plVar8;
            }
            fullPath._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            __x = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                  ((*local_230)->_M_dataplus)._M_p;
            std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                      ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&err,__x);
            local_180 = __x[1].
                        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_198._8_8_ =
                 __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pcStack_188 = __x[1].
                          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            cmake::IssueMessage(local_1c8,LOG,&fullPath,(cmListFileBacktrace *)&err);
            std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                      ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != paVar1) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
            if (local_1e8[0] != local_1d8) {
              operator_delete(local_1e8[0],local_1d8[0] + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      entries = (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 *)(local_230 + 1);
    } while (entries !=
             (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              *)local_1c0);
  }
LAB_0029a2b3:
  return (bool)(bVar14 & 1);
}

Assistant:

static bool processSources(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &srcs,
      UNORDERED_SET<std::string> &uniqueSrcs,
      cmGeneratorExpressionDAGChecker *dagChecker,
      std::string const& config, bool debugSources)
{
  cmMakefile *mf = tgt->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              tgt,
                                              dagChecker),
                                    entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition())
      {
      contextDependent = true;
      }

    for(std::vector<std::string>::iterator i = entrySources.begin();
        i != entrySources.end(); ++i)
      {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if(fullPath.empty())
        {
        if(!e.empty())
          {
          cmake* cm = mf->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e,
                          tgt->GetBacktrace());
          }
        return contextDependent;
        }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str()))
        {
        std::ostringstream err;
        if (!targetName.empty())
          {
          err << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_SOURCES:\n"
            "  \"" << src << "\"";
          }
        else
          {
          err << "Found relative path while evaluating sources of "
          "\"" << tgt->GetName() << "\":\n  \"" << src << "\"\n";
          }
        tgt->GetMakefile()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
        }
      src = fullPath;
      }
    std::string usedSources;
    for(std::vector<std::string>::iterator
          li = entrySources.begin(); li != entrySources.end(); ++li)
      {
      std::string src = *li;

      if(uniqueSrcs.insert(src).second)
        {
        srcs.push_back(src);
        if (debugSources)
          {
          usedSources += " * " + src + "\n";
          }
        }
      }
    if (!usedSources.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used sources for target ")
                            + tgt->GetName() + ":\n"
                            + usedSources, (*it)->ge->GetBacktrace());
      }
    }
  return contextDependent;
}